

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::SymDiffSplice
          (Geobucket<2UL> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  _List_node_base *p_Var1;
  ulong uVar2;
  pointer puVar3;
  ulong *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _List_node_base *p_Var8;
  pointer pMVar9;
  
  uVar2 = (polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
          super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size;
  puVar4 = (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (*puVar4 < uVar2) {
    lVar7 = 1;
    do {
      lVar5 = lVar7;
      if (lVar5 == (long)(this->_maxsizes).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4 >> 3) {
        NewBucket(this);
        uVar2 = (polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                _M_size;
        puVar4 = (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar7 = lVar5 + 1;
    } while (puVar4[lVar5] < uVar2);
  }
  else {
    lVar5 = 0;
  }
  lVar7 = lVar5 * 0x20;
  MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiffSplice
            ((this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5,polyRight);
  pMVar9 = (this->_buckets).
           super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = lVar5;
  if (puVar3[lVar5] <
      *(size_t *)
       ((long)&pMVar9[lVar5].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10)) {
    do {
      lVar6 = lVar6 + 1;
      if (lVar6 == (long)(this->_maxsizes).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3 >> 3) {
        NewBucket(this);
        pMVar9 = (this->_buckets).
                 super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiffSplice
                (pMVar9 + lVar5,
                 (MP<6UL,_GF2::MOGrevlex<6UL>_> *)
                 ((long)&pMVar9[1].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar7));
      std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
                ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
                 ((long)&(this->_buckets).
                         super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar7));
      pMVar9 = (this->_buckets).
               super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x20;
    } while (puVar3[lVar6] <
             *(size_t *)
              ((long)&pMVar9[lVar5].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                      super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10));
  }
  p_Var8 = (_List_node_base *)(pMVar9 + lVar5);
  std::__detail::_List_node_base::swap((_List_node_base *)(pMVar9 + lVar6),p_Var8);
  p_Var1 = p_Var8[1]._M_next;
  p_Var8[1]._M_next =
       *(_List_node_base **)
        ((long)&pMVar9[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
  *(_List_node_base **)
   ((long)&pMVar9[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10) = p_Var1;
  return;
}

Assistant:

void SymDiffSplice(MP& polyRight)
		{
			// поиск подходящей корзины 
			size_t i = 0, j;
			for (; polyRight.Size() > _maxsizes[i];)
				// корзины закончились?
				if (++i == _maxsizes.size()) NewBucket();
			// добавляем мономы в найденную корзину
			_buckets[j = i].SymDiffSplice(polyRight);
			while (_buckets[j].Size() > _maxsizes[i])
			{
				// корзины закончились?
				if (i + 1 == _maxsizes.size()) NewBucket();
				// перераспределяем мономы по корзинам 
				_buckets[j].SymDiffSplice(_buckets[++i]);
				_buckets[i].SetEmpty();
			}
			// меняем содержимое i-й и j-й корзин
			_buckets[i].Swap(_buckets[j]);
		}